

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O3

bool __thiscall
TCMallocImplementation::SetNumericProperty(TCMallocImplementation *this,char *name,size_t value)

{
  size_t sVar1;
  int iVar2;
  MallocExtension *pMVar3;
  bool bVar4;
  SpinLockHolder local_20;
  SpinLockHolder l;
  
  iVar2 = strcmp(name,"tcmalloc.max_total_thread_cache_bytes");
  if (iVar2 == 0) {
    local_20.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
    LOCK();
    bVar4 = tcmalloc::Static::pageheap_._8_4_ == 0;
    if (bVar4) {
      tcmalloc::Static::pageheap_._8_4_ = 1;
    }
    UNLOCK();
    if (!bVar4) {
      SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    }
    tcmalloc::ThreadCache::set_overall_thread_cache_size(value);
    sVar1 = FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
            FLAGS_tcmalloc_heap_limit_mb;
  }
  else {
    iVar2 = strcmp(name,"tcmalloc.min_per_thread_cache_bytes");
    if (iVar2 == 0) {
      tcmalloc::ThreadCache::min_per_thread_cache_size_ = value;
      return true;
    }
    iVar2 = strcmp(name,"tcmalloc.aggressive_memory_decommit");
    if (iVar2 == 0) {
      local_20.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
      LOCK();
      bVar4 = tcmalloc::Static::pageheap_._8_4_ == 0;
      if (bVar4) {
        tcmalloc::Static::pageheap_._8_4_ = 1;
      }
      UNLOCK();
      if (!bVar4) {
        SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
      }
      tcmalloc::Static::pageheap_[0x1830dc] = value != 0;
      sVar1 = FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
              FLAGS_tcmalloc_heap_limit_mb;
    }
    else {
      iVar2 = strcmp(name,"tcmalloc.heap_limit_mb");
      if (iVar2 != 0) {
        iVar2 = strcmp(name,"tcmalloc.sample_parameter");
        if (iVar2 == 0) {
          _FLAGS_tcmalloc_sample_parameter = value;
          pMVar3 = MallocExtension::instance();
          (*pMVar3->_vptr_MallocExtension[0xd])(pMVar3);
          return true;
        }
        return false;
      }
      local_20.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
      LOCK();
      bVar4 = tcmalloc::Static::pageheap_._8_4_ == 0;
      if (bVar4) {
        tcmalloc::Static::pageheap_._8_4_ = 1;
      }
      UNLOCK();
      sVar1 = value;
      if (!bVar4) {
        SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
        sVar1 = value;
      }
    }
  }
  FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::FLAGS_tcmalloc_heap_limit_mb =
       sVar1;
  SpinLockHolder::~SpinLockHolder(&local_20);
  return true;
}

Assistant:

virtual bool SetNumericProperty(const char* name, size_t value) {
    ASSERT(name != nullptr);

    if (strcmp(name, "tcmalloc.max_total_thread_cache_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      ThreadCache::set_overall_thread_cache_size(value);
      return true;
    }

    if (strcmp(name, "tcmalloc.min_per_thread_cache_bytes") == 0) {
      ThreadCache::set_min_per_thread_cache_size(value);
      return true;
    }

    if (strcmp(name, "tcmalloc.aggressive_memory_decommit") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      Static::pageheap()->SetAggressiveDecommit(value != 0);
      return true;
    }

    if (strcmp(name, "tcmalloc.heap_limit_mb") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      FLAGS_tcmalloc_heap_limit_mb = value;
      return true;
    }

    if (strcmp(name, "tcmalloc.sample_parameter") == 0) {
      FLAGS_tcmalloc_sample_parameter = value;
      // By clearing current thread's cache we force next allocations
      // to read freshly updated sample parameter. This is only going
      // to affect current thread, but this is better than nothing.
      MallocExtension::instance()->MarkThreadIdle();
      return true;
    }

    return false;
  }